

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,complex<float> m00,complex<float> m01,
          complex<float> m02,complex<float> m03,complex<float> m10,complex<float> m11,
          complex<float> m12,complex<float> m13,complex<float> m20,complex<float> m21,
          complex<float> m22,complex<float> m23,complex<float> m30,complex<float> m31,
          complex<float> m32,complex<float> m33)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  _ComplexT in_XMM1_Qa;
  _ComplexT in_XMM2_Qa;
  _ComplexT in_XMM3_Qa;
  _ComplexT in_XMM4_Qa;
  _ComplexT in_XMM5_Qa;
  _ComplexT in_XMM6_Qa;
  _ComplexT in_XMM7_Qa;
  
  this->size_ = 4;
  alloc_unique_array<std::complex<float>>((dense *)&this->data_,0x10);
  ((this->data_)._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)->_M_value =
       CONCAT44(in_XMM0_Db,in_XMM0_Da);
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[1]._M_value = in_XMM4_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[2]._M_value = m11._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[3]._M_value = m21._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[4]._M_value = in_XMM1_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[5]._M_value = in_XMM5_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[6]._M_value = m12._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[7]._M_value = m22._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[8]._M_value = in_XMM2_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[9]._M_value = in_XMM6_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[10]._M_value = m13._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[0xb]._M_value = m23._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[0xc]._M_value = in_XMM3_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[0xd]._M_value = in_XMM7_Qa;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[0xe]._M_value = m20._M_value;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[0xf]._M_value = m30._M_value;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 , const T m02 , const T m03 ,
                      const T m10 , const T m11 , const T m12 , const T m13 ,
                      const T m20 , const T m21 , const T m22 , const T m23 ,
                      const T m30 , const T m31 , const T m32 , const T m33 )
        : size_( 4 )
        , data_( alloc_unique_array< T >( 16 ) )
        {
          data_[ 0] = m00 ; data_[ 1] = m10 ; data_[ 2] = m20 ; data_[ 3] = m30;
          data_[ 4] = m01 ; data_[ 5] = m11 ; data_[ 6] = m21 ; data_[ 7] = m31;
          data_[ 8] = m02 ; data_[ 9] = m12 ; data_[10] = m22 ; data_[11] = m32;
          data_[12] = m03 ; data_[13] = m13 ; data_[14] = m23 ; data_[15] = m33;
        }